

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPVariantClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPVariantClause *this)

{
  OpenMPDirective *pOVar1;
  bool bVar2;
  OpenMPClauseKind OVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer __lhs;
  string clause_string;
  string parameter_string;
  string beginning_symbol;
  string ending_symbol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  OpenMPClauseKind local_17c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  OpenMPVariantClause *local_158;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140 [16];
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_150 = local_140;
  local_148 = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_178.field_2._M_local_buf[0] = '\0';
  local_140[0] = 0;
  local_130 = local_120;
  local_128 = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_120[0] = 0;
  OVar3 = (this->super_OpenMPClause).kind;
  if ((OVar3 == OMPC_when) || (OVar3 == OMPC_match)) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    std::operator<<((ostream *)&std::cout,"The variant clause is not supported.\n");
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  bVar2 = std::operator!=(&(this->user_condition_expression).first,"");
  if (bVar2) {
    std::operator+(&local_90,"user = {condition(score(",&(this->user_condition_expression).first);
    std::operator+(&local_1a0,&local_90,"): ");
    std::operator+(&local_1e8,&local_1a0,&(this->user_condition_expression).second);
    std::operator+(&local_208,&local_1e8,")}");
    std::operator+(&bStack_228,&local_208,", ");
    std::__cxx11::string::append((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1a0);
    pbVar4 = &local_90;
LAB_0015ebe2:
    std::__cxx11::string::~string((string *)pbVar4);
  }
  else {
    pbVar4 = &(this->user_condition_expression).second;
    bVar2 = std::operator!=(pbVar4,"");
    if (bVar2) {
      std::operator+(&local_1e8,"user = {condition(",pbVar4);
      std::operator+(&local_208,&local_1e8,")}");
      std::operator+(&bStack_228,&local_208,", ");
      std::__cxx11::string::append((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&bStack_228);
      std::__cxx11::string::~string((string *)&local_208);
      pbVar4 = &local_1e8;
      goto LAB_0015ebe2;
    }
  }
  if ((this->construct_directives).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->construct_directives).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::append((char *)&local_1c8);
    local_1a8 = __return_storage_ptr__;
    local_17c = OVar3;
    local_158 = this;
    for (__lhs = (this->construct_directives).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != (local_158->construct_directives).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      bVar2 = std::operator!=(&__lhs->first,"");
      if (bVar2) {
        std::operator+(&local_208,"score(",&__lhs->first);
        std::operator+(&bStack_228,&local_208,"): ");
        std::__cxx11::string::operator=((string *)&local_150,(string *)&bStack_228);
        std::__cxx11::string::~string((string *)&bStack_228);
        std::__cxx11::string::~string((string *)&local_208);
      }
      else if ((__lhs->second->clauses)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::__cxx11::string::assign((char *)&local_150);
      }
      else {
        std::__cxx11::string::assign((char *)&local_150);
      }
      std::__cxx11::string::assign((char *)&local_130);
      pOVar1 = __lhs->second;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"",(allocator<char> *)&local_1e8);
      std::__cxx11::string::string((string *)&local_50,(string *)&local_150);
      std::__cxx11::string::string((string *)&local_70,(string *)&local_130);
      OpenMPDirective::generatePragmaString(&local_208,pOVar1,&local_b0,&local_50,&local_70);
      std::operator+(&bStack_228,&local_208,", ");
      std::__cxx11::string::append((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&bStack_228);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    std::__cxx11::string::substr((ulong)&bStack_228,(ulong)&local_1c8);
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&bStack_228);
    std::__cxx11::string::~string((string *)&bStack_228);
    __return_storage_ptr__ = local_1a8;
    std::__cxx11::string::append((char *)&local_1c8);
    this = local_158;
    OVar3 = local_17c;
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  local_178._M_string_length = 0;
  *local_178._M_dataplus._M_p = '\0';
  local_1c8._M_string_length = 0;
  *local_1c8._M_dataplus._M_p = '\0';
  if ((this->arch_expression).first._M_string_length == 0) {
    if ((this->arch_expression).second._M_string_length != 0) {
      std::operator+(&local_208,"arch(",&(this->arch_expression).second);
      std::operator+(&bStack_228,&local_208,"), ");
      std::__cxx11::string::append((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&bStack_228);
      pbVar4 = &local_208;
      goto LAB_0015ef28;
    }
  }
  else {
    std::operator+(&local_1a0,"arch(score(",&(this->arch_expression).first);
    std::operator+(&local_1e8,&local_1a0,"): ");
    std::operator+(&local_208,&local_1e8,&(this->arch_expression).second);
    std::operator+(&bStack_228,&local_208,"), ");
    std::__cxx11::string::append((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    pbVar4 = &local_1a0;
LAB_0015ef28:
    std::__cxx11::string::~string((string *)pbVar4);
  }
  if ((this->isa_expression).first._M_string_length == 0) {
    if ((this->isa_expression).second._M_string_length != 0) {
      std::operator+(&local_208,"isa(",&(this->isa_expression).second);
      std::operator+(&bStack_228,&local_208,"), ");
      std::__cxx11::string::append((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&bStack_228);
      pbVar4 = &local_208;
      goto LAB_0015f01c;
    }
  }
  else {
    std::operator+(&local_1a0,"isa(score(",&(this->isa_expression).first);
    std::operator+(&local_1e8,&local_1a0,"): ");
    std::operator+(&local_208,&local_1e8,&(this->isa_expression).second);
    std::operator+(&bStack_228,&local_208,"), ");
    std::__cxx11::string::append((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    pbVar4 = &local_1a0;
LAB_0015f01c:
    std::__cxx11::string::~string((string *)pbVar4);
  }
  switch((this->context_kind_name).second) {
  case OMPC_CONTEXT_KIND_host:
    break;
  case OMPC_CONTEXT_KIND_nohost:
    break;
  case OMPC_CONTEXT_KIND_any:
    break;
  case OMPC_CONTEXT_KIND_cpu:
    break;
  case OMPC_CONTEXT_KIND_gpu:
    break;
  case OMPC_CONTEXT_KIND_fpga:
    break;
  case OMPC_CONTEXT_KIND_unknown:
    goto switchD_0015f03c_caseD_6;
  default:
    std::operator<<((ostream *)&std::cout,"The context kind is not supported.\n");
    goto switchD_0015f03c_caseD_6;
  }
  std::__cxx11::string::assign((char *)&local_178);
switchD_0015f03c_caseD_6:
  if ((this->context_kind_name).first._M_string_length == 0) {
    if (local_178._M_string_length != 0) {
      std::operator+(&local_208,"kind(",&local_178);
      std::operator+(&bStack_228,&local_208,"), ");
      std::__cxx11::string::append((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&bStack_228);
      pbVar4 = &local_208;
      goto LAB_0015f186;
    }
  }
  else {
    std::operator+(&local_1a0,"kind(score(",&(this->context_kind_name).first);
    std::operator+(&local_1e8,&local_1a0,"): ");
    std::operator+(&local_208,&local_1e8,&local_178);
    std::operator+(&bStack_228,&local_208,"), ");
    std::__cxx11::string::append((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    pbVar4 = &local_1a0;
LAB_0015f186:
    std::__cxx11::string::~string((string *)pbVar4);
  }
  if (local_1c8._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_1c8);
    std::operator+(&local_208,"device = {",&local_1e8);
    std::operator+(&bStack_228,&local_208,"}, ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  local_1c8._M_string_length = 0;
  *local_1c8._M_dataplus._M_p = '\0';
  local_178._M_string_length = 0;
  *local_178._M_dataplus._M_p = '\0';
  switch((this->context_vendor_name).second) {
  case OMPC_CONTEXT_VENDOR_amd:
    break;
  case OMPC_CONTEXT_VENDOR_arm:
    break;
  case OMPC_CONTEXT_VENDOR_bsc:
    break;
  case OMPC_CONTEXT_VENDOR_cray:
    break;
  case OMPC_CONTEXT_VENDOR_fujitsu:
    break;
  case OMPC_CONTEXT_VENDOR_gnu:
    break;
  case OMPC_CONTEXT_VENDOR_ibm:
    break;
  case OMPC_CONTEXT_VENDOR_intel:
    break;
  case OMPC_CONTEXT_VENDOR_llvm:
    break;
  case OMPC_CONTEXT_VENDOR_pgi:
    break;
  case OMPC_CONTEXT_VENDOR_ti:
    break;
  default:
    std::operator<<((ostream *)&std::cout,"The context vendor is not supported.\n");
    goto switchD_0015f238_caseD_d;
  case OMPC_CONTEXT_VENDOR_unknown:
    break;
  case OMPC_CONTEXT_VENDOR_unspecified:
    goto switchD_0015f238_caseD_d;
  }
  std::__cxx11::string::assign((char *)&local_178);
switchD_0015f238_caseD_d:
  if ((this->context_vendor_name).first._M_string_length == 0) {
    if (local_178._M_string_length != 0) {
      std::operator+(&local_208,"vendor(",&local_178);
      std::operator+(&bStack_228,&local_208,"), ");
      std::__cxx11::string::append((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&bStack_228);
      pbVar4 = &local_208;
      goto LAB_0015f3b8;
    }
  }
  else {
    std::operator+(&local_1a0,"vendor(score(",&(this->context_vendor_name).first);
    std::operator+(&local_1e8,&local_1a0,"): ");
    std::operator+(&local_208,&local_1e8,&local_178);
    std::operator+(&bStack_228,&local_208,"), ");
    std::__cxx11::string::append((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    pbVar4 = &local_1a0;
LAB_0015f3b8:
    std::__cxx11::string::~string((string *)pbVar4);
  }
  if ((this->extension_expression).first._M_string_length == 0) {
    if ((this->extension_expression).second._M_string_length == 0) goto LAB_0015f4b1;
    std::operator+(&local_208,"extension(",&(this->extension_expression).second);
    std::operator+(&bStack_228,&local_208,"), ");
    std::__cxx11::string::append((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    pbVar4 = &local_208;
  }
  else {
    std::operator+(&local_1a0,"extension(score(",&(this->extension_expression).first);
    std::operator+(&local_1e8,&local_1a0,"): ");
    std::operator+(&local_208,&local_1e8,&(this->extension_expression).second);
    std::operator+(&bStack_228,&local_208,"), ");
    std::__cxx11::string::append((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    pbVar4 = &local_1a0;
  }
  std::__cxx11::string::~string((string *)pbVar4);
LAB_0015f4b1:
  if (local_1c8._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_1c8);
    std::operator+(&local_208,"implementation = {",&local_1e8);
    std::operator+(&bStack_228,&local_208,"}, ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  local_1c8._M_string_length = 0;
  *local_1c8._M_dataplus._M_p = '\0';
  std::__cxx11::string::substr((ulong)&bStack_228,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_228);
  std::__cxx11::string::~string((string *)&bStack_228);
  if (OVar3 == OMPC_when) {
    std::__cxx11::string::assign((char *)&local_1c8);
    pOVar1 = (OpenMPDirective *)this[1].super_OpenMPClause._vptr_OpenMPClause;
    if (pOVar1 != (OpenMPDirective *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"",(allocator<char> *)&local_208);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"",(allocator<char> *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"",(allocator<char> *)&local_1a0);
      OpenMPDirective::generatePragmaString(&bStack_228,pOVar1,&local_d0,&local_f0,&local_110);
      std::__cxx11::string::append((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&bStack_228);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
  }
  std::operator+(&bStack_228,&local_1c8,") ");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&bStack_228);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPVariantClause::toString() {

    std::string result;
    std::string clause_string;
    std::string parameter_string;
    std::string beginning_symbol;
    std::string ending_symbol;
    std::pair<std::string, std::string>* parameter_pair_string = NULL;
    OpenMPDirective* variant_directive = NULL;
    OpenMPClauseKind clause_kind = this->getKind();
    switch (clause_kind) {
        case OMPC_when:
            result = "when";
            break;
        case OMPC_match:
            result = "match";
            break;
        default:
            std::cout << "The variant clause is not supported.\n";
    };
    result += " (";

    // check user
    parameter_pair_string = this->getUserCondition();
    if (parameter_pair_string->first != "") {
        clause_string += "user = {condition(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + ")}" + ", ";
    }
    else if (parameter_pair_string->second != "") {
        clause_string += "user = {condition(" + parameter_pair_string->second + ")}" + ", ";
    };

    // check construct
    std::vector<std::pair<std::string, OpenMPDirective*> >* parameter_pair_directives = this->getConstructDirective();
    if (parameter_pair_directives->size() != 0) {
        clause_string += "construct = {";
        std::vector<std::pair<std::string, OpenMPDirective*> >::iterator iter;
        for (iter = parameter_pair_directives->begin(); iter != parameter_pair_directives->end(); iter++) {
            if ((*iter).first != "") {
                beginning_symbol = "score(" + (*iter).first + "): ";
                ending_symbol = ")";
            }
            else if ((*iter).second->getAllClauses()->size() != 0){
                beginning_symbol = "(";
                ending_symbol = ")";
            }
            else {
                beginning_symbol = "";
                ending_symbol = "";
            };
            clause_string += (*iter).second->generatePragmaString("", beginning_symbol, ending_symbol) + ", ";
        };
        clause_string = clause_string.substr(0, clause_string.size()-2);
        clause_string += "}, ";
    }

    result += clause_string;
    parameter_string.clear();

    // check device
    clause_string.clear();
    // check device arch
    parameter_pair_string = this->getArchExpression();
    if (parameter_pair_string->first.size() > 0) {
        clause_string += "arch(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + "), ";
    }
    else if (parameter_pair_string->second.size() > 0) {
        clause_string += "arch(" + parameter_pair_string->second + "), ";
    };

    // check device isa
    parameter_pair_string = this->getIsaExpression();
    if (parameter_pair_string->first.size() > 0) {
        clause_string += "isa(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + "), ";
    }
    else if (parameter_pair_string->second.size() > 0) {
        clause_string += "isa(" + parameter_pair_string->second + "), ";
    };

    // check device_kind
    std::pair<std::string, OpenMPClauseContextKind>* context_kind = this->getContextKind();
    switch (context_kind->second) {
        case OMPC_CONTEXT_KIND_host:
            parameter_string = "host";
            break;
        case OMPC_CONTEXT_KIND_nohost:
            parameter_string = "nohost";
            break;
        case OMPC_CONTEXT_KIND_any:
            parameter_string = "any";
            break;
        case OMPC_CONTEXT_KIND_cpu:
            parameter_string = "cpu";
            break;
        case OMPC_CONTEXT_KIND_gpu:
            parameter_string = "gpu";
            break;
        case OMPC_CONTEXT_KIND_fpga:
            parameter_string = "fpga";
            break;
        case OMPC_CONTEXT_KIND_unknown:
            break;
        default:
            std::cout << "The context kind is not supported.\n";
    };

    if (context_kind->first.size() > 0) {
        clause_string += "kind(score(" + context_kind->first + "): " + parameter_string + "), ";
    }
    else if (parameter_string.size() > 0) {
        clause_string += "kind(" + parameter_string + "), ";
    };

    if (clause_string.size() > 0) {
        result += "device = {" + clause_string.substr(0, clause_string.size()-2) + "}, ";
    };

    // check implementation
    clause_string.clear();
    parameter_string.clear();
    // check implementation vendor
    std::pair<std::string, OpenMPClauseContextVendor>* context_vendor = this->getImplementationKind();
    switch (context_vendor->second) {
        case OMPC_CONTEXT_VENDOR_amd:
            parameter_string = "amd";
            break;
        case OMPC_CONTEXT_VENDOR_arm:
            parameter_string = "arm";
            break;
        case OMPC_CONTEXT_VENDOR_bsc:
            parameter_string = "bsc";
            break;
        case OMPC_CONTEXT_VENDOR_cray:
            parameter_string = "cray";
            break;
        case OMPC_CONTEXT_VENDOR_fujitsu:
            parameter_string = "fujitsu";
            break;
        case OMPC_CONTEXT_VENDOR_gnu:
            parameter_string = "gnu";
            break;
        case OMPC_CONTEXT_VENDOR_ibm:
            parameter_string = "ibm";
            break;
        case OMPC_CONTEXT_VENDOR_intel:
            parameter_string = "intel";
            break;
        case OMPC_CONTEXT_VENDOR_llvm:
            parameter_string = "llvm";
            break;
        case OMPC_CONTEXT_VENDOR_pgi:
            parameter_string = "pgi";
            break;
        case OMPC_CONTEXT_VENDOR_ti:
            parameter_string = "ti";
            break;
        case OMPC_CONTEXT_VENDOR_unknown:
            parameter_string = "unknown";
            break;
        case OMPC_CONTEXT_VENDOR_unspecified:
            break;
        default:
            std::cout << "The context vendor is not supported.\n";
    };
    if (context_vendor->first.size() > 0) {
        clause_string += "vendor(score(" + context_vendor->first + "): " + parameter_string + "), ";
    }
    else if (parameter_string.size() > 0) {
        clause_string += "vendor(" + parameter_string + "), ";
    };

    // check implementation extension
    parameter_pair_string = this->getExtensionExpression();
    if (parameter_pair_string->first.size() > 0) {
        clause_string += "extension(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + "), ";
    }
    else if (parameter_pair_string->second.size() > 0) {
        clause_string += "extension(" + parameter_pair_string->second + "), ";
    };

    if (clause_string.size() > 0) {
        result += "implementation = {" + clause_string.substr(0, clause_string.size()-2) + "}, ";
    };

    clause_string.clear();
    result = result.substr(0, result.size()-2);

    if (clause_kind == OMPC_when) {
        clause_string = " : ";
        variant_directive = ((OpenMPWhenClause*)this)->getVariantDirective();
        if (variant_directive != NULL) {
            clause_string += variant_directive->generatePragmaString("");
        };
    };

    result += clause_string + ") ";

    return result;
}